

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O0

void coda_mem_type_delete(coda_dynamic_type *type)

{
  int local_14;
  int i;
  coda_dynamic_type *type_local;
  
  if (type == (coda_dynamic_type *)0x0) {
    __assert_fail("type != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                  ,0x2a,"void coda_mem_type_delete(coda_dynamic_type *)");
  }
  if (type->backend != coda_backend_memory) {
    __assert_fail("type->backend == coda_backend_memory",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                  ,0x2b,"void coda_mem_type_delete(coda_dynamic_type *)");
  }
  switch(type[1].backend) {
  case coda_backend_ascii:
    if (type[2].definition != (coda_type *)0x0) {
      for (local_14 = 0; (long)local_14 < *(long *)(type + 2); local_14 = local_14 + 1) {
        if (*(long *)(&(type[2].definition)->format + (long)local_14 * 2) != 0) {
          coda_dynamic_type_delete
                    (*(coda_dynamic_type **)(&(type[2].definition)->format + (long)local_14 * 2));
        }
      }
      free(type[2].definition);
    }
    break;
  case coda_backend_binary:
    if (type[2].definition != (coda_type *)0x0) {
      for (local_14 = 0; (long)local_14 < *(long *)(type + 2); local_14 = local_14 + 1) {
        if (*(long *)(&(type[2].definition)->format + (long)local_14 * 2) != 0) {
          coda_dynamic_type_delete
                    (*(coda_dynamic_type **)(&(type[2].definition)->format + (long)local_14 * 2));
        }
      }
      free(type[2].definition);
    }
    break;
  case 2:
    break;
  case 3:
    if (*(long *)(type + 2) != 0) {
      coda_dynamic_type_delete(*(coda_dynamic_type **)(type + 2));
    }
  }
  if (type[1].definition != (coda_type *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)type[1].definition);
  }
  if (type->definition != (coda_type *)0x0) {
    coda_type_release(type->definition);
  }
  free(type);
  return;
}

Assistant:

void coda_mem_type_delete(coda_dynamic_type *type)
{
    int i;

    assert(type != NULL);
    assert(type->backend == coda_backend_memory);

    switch (((coda_mem_type *)type)->tag)
    {
        case tag_mem_record:
            if (((coda_mem_record *)type)->field_type != NULL)
            {
                for (i = 0; i < ((coda_mem_record *)type)->num_fields; i++)
                {
                    if (((coda_mem_record *)type)->field_type[i] != NULL)
                    {
                        coda_dynamic_type_delete(((coda_mem_record *)type)->field_type[i]);
                    }
                }
                free(((coda_mem_record *)type)->field_type);
            }
            break;
        case tag_mem_array:
            if (((coda_mem_array *)type)->element != NULL)
            {
                for (i = 0; i < ((coda_mem_array *)type)->num_elements; i++)
                {
                    if (((coda_mem_array *)type)->element[i] != NULL)
                    {
                        coda_dynamic_type_delete(((coda_mem_array *)type)->element[i]);
                    }
                }
                free(((coda_mem_array *)type)->element);
            }
            break;
        case tag_mem_data:
            break;
        case tag_mem_special:
            if (((coda_mem_special *)type)->base_type != NULL)
            {
                coda_dynamic_type_delete(((coda_mem_special *)type)->base_type);
            }
            break;
    }
    if (((coda_mem_type *)type)->attributes != NULL)
    {
        coda_dynamic_type_delete(((coda_mem_type *)type)->attributes);
    }
    if (type->definition != NULL)
    {
        coda_type_release((coda_type *)type->definition);
    }
    free(type);
}